

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio-lite.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* getFilesList(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *__return_storage_ptr__,string *cpioArchivePath)

{
  bool bVar1;
  ssize_t sVar2;
  CpioException *this;
  size_t sVar3;
  pointer pcVar4;
  size_t realBytesToSkip;
  size_t bytesToSkip;
  undefined1 local_b0 [8];
  string filename;
  __array cFilename;
  size_t realFilenameSize;
  size_t filenameSize;
  string local_70;
  DescriptorWrapper local_40;
  byte local_3b;
  undefined1 local_3a [2];
  DescriptorWrapper fd;
  header_old_cpio header;
  ssize_t sz;
  string *cpioArchivePath_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filenames;
  
  local_3b = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  DescriptorWrapper::openFile(&local_40,cpioArchivePath,0);
  do {
    sVar2 = DescriptorWrapper::readTo(&local_40,local_3a,0x1a);
    if (sVar2 == 0) {
      filenameSize._6_1_ = 1;
      this = (CpioException *)__cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Unexpected EOF",(allocator<char> *)((long)&filenameSize + 7));
      CpioException::CpioException(this,InvalidInputArchive,&local_70);
      filenameSize._6_1_ = 0;
      __cxa_throw(this,&CpioException::typeinfo,CpioException::~CpioException);
    }
    bVar1 = isHeaderLittleEndian((header_old_cpio *)local_3a);
    if (bVar1) {
      switchEndianness((header_old_cpio *)local_3a);
    }
    sVar3 = getFilenameSizeFromBigEndianHeader((header_old_cpio *)local_3a);
    std::make_unique<char[]>((size_t)((long)&filename.field_2 + 8));
    pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                       ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                        ((long)&filename.field_2 + 8));
    DescriptorWrapper::readTo(&local_40,pcVar4,sVar3 + ((uint)sVar3 & 1));
    pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                       ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                        ((long)&filename.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b0,pcVar4,(allocator<char> *)((long)&bytesToSkip + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&bytesToSkip + 7));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b0,"TRAILER!!!");
    if (bVar1) {
      bytesToSkip._0_4_ = 2;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_b0);
      sVar3 = getFileSizeFromBigEndianHeader((header_old_cpio *)local_3a);
      DescriptorWrapper::seek(&local_40,sVar3 + ((uint)sVar3 & 1),1);
      bytesToSkip._0_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_b0);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)((long)&filename.field_2 + 8));
  } while ((int)bytesToSkip == 0);
  local_3b = 1;
  bytesToSkip._0_4_ = 1;
  DescriptorWrapper::~DescriptorWrapper(&local_40);
  if ((local_3b & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> getFilesList(const string& cpioArchivePath) 
{
	ssize_t sz = -1;
	header_old_cpio header;
	std::vector<std::string> filenames;

	DescriptorWrapper fd = DescriptorWrapper::openFile(cpioArchivePath, O_RDONLY);

	for(;;) {
		sz = fd.readTo(&header, sizeof(header));
		if (sz == 0)
			throw CpioException(CpioException::InvalidInputArchive, "Unexpected EOF");
		if (isHeaderLittleEndian(header))
			switchEndianness(header);
		
		auto filenameSize = getFilenameSizeFromBigEndianHeader(header);
		auto realFilenameSize = filenameSize + filenameSize%2;
		auto cFilename = make_unique<char[]>(realFilenameSize);

		sz = fd.readTo(cFilename.get(), realFilenameSize);
		string filename(cFilename.get());
		if (filename == "TRAILER!!!")
			break;
		else
			filenames.push_back(filename);

		auto bytesToSkip = getFileSizeFromBigEndianHeader(header);
		auto realBytesToSkip = bytesToSkip + bytesToSkip%2;
		fd.seek((off_t)realBytesToSkip, SEEK_CUR);
	}

	return filenames;
}